

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc.c
# Opt level: O3

void ipc_on_connection(uv_stream_t *server,int status)

{
  int iVar1;
  undefined8 uVar2;
  uv_pipe_t *puVar3;
  void *pvVar4;
  undefined8 *extraout_RDX;
  uv_pipe_t *unaff_RBX;
  int iVar5;
  undefined8 *__size;
  uv_tcp_t *puVar6;
  long *plVar7;
  int64_t eval_b;
  int64_t eval_a;
  int64_t eval_b_3;
  undefined8 uStack_100;
  code *pcStack_f8;
  long lStack_f0;
  long lStack_e8;
  undefined1 auStack_e0 [16];
  uv_pipe_t *puStack_d0;
  long lStack_c8;
  long lStack_c0;
  undefined1 auStack_b8 [16];
  undefined1 auStack_a8 [16];
  uv_pipe_t *puStack_98;
  undefined8 uStack_88;
  code *pcStack_80;
  long alStack_78 [2];
  undefined1 auStack_68 [16];
  uv_pipe_t *puStack_58;
  undefined1 auStack_50 [16];
  uv_loop_t *apuStack_40 [2];
  undefined1 local_18 [16];
  uv_alloc_cb local_8;
  
  if (connection_accepted != '\0') {
    return;
  }
  local_18._0_8_ = SEXT48(status);
  if (local_18._0_8_ == 0) {
    if (server != (uv_stream_t *)&tcp_server) goto LAB_001aa424;
    iVar1 = uv_tcp_init(tcp_server.loop,0x36cc70);
    local_18._0_8_ = SEXT48(iVar1);
    if (local_18._0_8_ != 0) goto LAB_001aa429;
    iVar1 = uv_accept(&tcp_server,0x36cc70);
    local_18._0_8_ = SEXT48(iVar1);
    if (local_18._0_8_ != 0) goto LAB_001aa438;
    uv_close(0x36cc70,close_cb);
    local_18 = uv_buf_init("accepted_connection\n",0x14);
    iVar1 = uv_write2(&conn_notify_req,&channel,local_18,1,0,conn_notify_write_cb);
    local_8 = (uv_alloc_cb)0x0;
    if (iVar1 == 0) {
      connection_accepted = 1;
      return;
    }
  }
  else {
    ipc_on_connection_cold_1();
LAB_001aa424:
    ipc_on_connection_cold_2();
LAB_001aa429:
    ipc_on_connection_cold_3();
LAB_001aa438:
    ipc_on_connection_cold_4();
  }
  ipc_on_connection_cold_5();
  puVar6 = (uv_tcp_t *)auStack_50;
  puStack_58 = (uv_pipe_t *)0x1aa460;
  uVar2 = uv_default_loop();
  puStack_58 = (uv_pipe_t *)0x1aa474;
  iVar1 = uv_pipe_init(uVar2,&channel,1);
  apuStack_40[0] = (uv_loop_t *)(long)iVar1;
  auStack_50._0_8_ = (uv_loop_t *)0x0;
  if (apuStack_40[0] == (uv_loop_t *)0x0) {
    unaff_RBX = &channel;
    puStack_58 = (uv_pipe_t *)0x1aa4a3;
    uv_pipe_open(&channel,0);
    apuStack_40[0] = (uv_loop_t *)0x1;
    puStack_58 = (uv_pipe_t *)0x1aa4b4;
    iVar1 = uv_is_readable(&channel);
    auStack_50._0_8_ = SEXT48(iVar1);
    if (apuStack_40[0] != (uv_loop_t *)auStack_50._0_8_) goto LAB_001aa78b;
    apuStack_40[0] = (uv_loop_t *)0x1;
    puStack_58 = (uv_pipe_t *)0x1aa4de;
    iVar1 = uv_is_writable(&channel);
    auStack_50._0_8_ = SEXT48(iVar1);
    if (apuStack_40[0] != (uv_loop_t *)auStack_50._0_8_) goto LAB_001aa798;
    puStack_58 = (uv_pipe_t *)0x1aa4ff;
    iVar1 = uv_is_closing(&channel);
    apuStack_40[0] = (uv_loop_t *)(long)iVar1;
    auStack_50._0_8_ = (uv_loop_t *)0x0;
    if (apuStack_40[0] != (uv_loop_t *)0x0) goto LAB_001aa7a5;
    puStack_58 = (uv_pipe_t *)0x1aa522;
    uVar2 = uv_default_loop();
    puStack_58 = (uv_pipe_t *)0x1aa531;
    iVar1 = uv_tcp_init(uVar2,&tcp_server);
    apuStack_40[0] = (uv_loop_t *)(long)iVar1;
    auStack_50._0_8_ = (uv_loop_t *)0x0;
    if (apuStack_40[0] != (uv_loop_t *)0x0) goto LAB_001aa7b2;
    puStack_58 = (uv_pipe_t *)0x1aa565;
    iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,apuStack_40);
    auStack_50._0_8_ = SEXT48(iVar1);
    auStack_50._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_50._0_8_ != (uv_loop_t *)0x0) goto LAB_001aa7bf;
    puStack_58 = (uv_pipe_t *)0x1aa596;
    iVar1 = uv_tcp_bind(&tcp_server,apuStack_40,0);
    auStack_50._0_8_ = SEXT48(iVar1);
    auStack_50._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_50._0_8_ != (uv_loop_t *)0x0) goto LAB_001aa7cc;
    puStack_58 = (uv_pipe_t *)0x1aa5cc;
    iVar1 = uv_listen(&tcp_server,0x80,ipc_on_connection_tcp_conn);
    auStack_50._0_8_ = SEXT48(iVar1);
    auStack_50._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_50._0_8_ != (uv_loop_t *)0x0) goto LAB_001aa7d9;
    puStack_58 = (uv_pipe_t *)0x1aa5ef;
    uVar2 = uv_default_loop();
    puStack_58 = (uv_pipe_t *)0x1aa5fe;
    iVar1 = uv_tcp_init(uVar2,0x36cc70);
    auStack_50._0_8_ = SEXT48(iVar1);
    auStack_50._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_50._0_8_ != (uv_loop_t *)0x0) goto LAB_001aa7e6;
    puStack_58 = (uv_pipe_t *)0x1aa632;
    iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,apuStack_40);
    auStack_50._0_8_ = SEXT48(iVar1);
    auStack_50._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_50._0_8_ != (uv_loop_t *)0x0) goto LAB_001aa7f3;
    puStack_58 = (uv_pipe_t *)0x1aa66f;
    iVar1 = uv_tcp_connect(&conn,0x36cc70,apuStack_40,connect_child_process_cb);
    auStack_50._0_8_ = SEXT48(iVar1);
    auStack_50._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_50._0_8_ != (uv_loop_t *)0x0) goto LAB_001aa800;
    puStack_58 = (uv_pipe_t *)0x1aa692;
    uVar2 = uv_default_loop();
    puStack_58 = (uv_pipe_t *)0x1aa69c;
    iVar1 = uv_run(uVar2,0);
    auStack_50._0_8_ = SEXT48(iVar1);
    auStack_50._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_50._0_8_ != (uv_loop_t *)0x0) goto LAB_001aa80d;
    auStack_50._0_8_ = (uv_loop_t *)0x1;
    auStack_50._8_8_ = SEXT48(tcp_conn_read_cb_called);
    if ((uv_loop_t *)auStack_50._8_8_ != (uv_loop_t *)0x1) goto LAB_001aa81a;
    auStack_50._0_8_ = (uv_loop_t *)0x1;
    auStack_50._8_8_ = SEXT48(tcp_conn_write_cb_called);
    if ((uv_loop_t *)auStack_50._8_8_ != (uv_loop_t *)0x1) goto LAB_001aa827;
    auStack_50._0_8_ = (uv_loop_t *)0x4;
    auStack_50._8_8_ = SEXT48(close_cb_called);
    if ((uv_loop_t *)auStack_50._8_8_ != (uv_loop_t *)0x4) goto LAB_001aa834;
    puStack_58 = (uv_pipe_t *)0x1aa728;
    unaff_RBX = (uv_pipe_t *)uv_default_loop();
    puStack_58 = (uv_pipe_t *)0x1aa73c;
    uv_walk(unaff_RBX,close_walk_cb,0);
    puStack_58 = (uv_pipe_t *)0x1aa746;
    uv_run(unaff_RBX,0);
    auStack_50._0_8_ = (uv_loop_t *)0x0;
    puStack_58 = (uv_pipe_t *)0x1aa753;
    uVar2 = uv_default_loop();
    puStack_58 = (uv_pipe_t *)0x1aa75b;
    iVar1 = uv_loop_close(uVar2);
    auStack_50._8_8_ = SEXT48(iVar1);
    if (auStack_50._0_8_ == auStack_50._8_8_) {
      puStack_58 = (uv_pipe_t *)0x1aa776;
      uv_library_shutdown();
      return;
    }
  }
  else {
    puStack_58 = (uv_pipe_t *)0x1aa78b;
    ipc_helper_tcp_connection_cold_1();
LAB_001aa78b:
    puStack_58 = (uv_pipe_t *)0x1aa798;
    ipc_helper_tcp_connection_cold_2();
LAB_001aa798:
    puStack_58 = (uv_pipe_t *)0x1aa7a5;
    ipc_helper_tcp_connection_cold_3();
LAB_001aa7a5:
    puStack_58 = (uv_pipe_t *)0x1aa7b2;
    ipc_helper_tcp_connection_cold_4();
LAB_001aa7b2:
    puStack_58 = (uv_pipe_t *)0x1aa7bf;
    ipc_helper_tcp_connection_cold_5();
LAB_001aa7bf:
    puStack_58 = (uv_pipe_t *)0x1aa7cc;
    ipc_helper_tcp_connection_cold_6();
LAB_001aa7cc:
    puStack_58 = (uv_pipe_t *)0x1aa7d9;
    ipc_helper_tcp_connection_cold_7();
LAB_001aa7d9:
    puStack_58 = (uv_pipe_t *)0x1aa7e6;
    ipc_helper_tcp_connection_cold_8();
LAB_001aa7e6:
    puStack_58 = (uv_pipe_t *)0x1aa7f3;
    ipc_helper_tcp_connection_cold_9();
LAB_001aa7f3:
    puStack_58 = (uv_pipe_t *)0x1aa800;
    ipc_helper_tcp_connection_cold_10();
LAB_001aa800:
    puStack_58 = (uv_pipe_t *)0x1aa80d;
    ipc_helper_tcp_connection_cold_11();
LAB_001aa80d:
    puStack_58 = (uv_pipe_t *)0x1aa81a;
    ipc_helper_tcp_connection_cold_12();
LAB_001aa81a:
    puStack_58 = (uv_pipe_t *)0x1aa827;
    ipc_helper_tcp_connection_cold_13();
LAB_001aa827:
    puStack_58 = (uv_pipe_t *)0x1aa834;
    ipc_helper_tcp_connection_cold_14();
LAB_001aa834:
    puStack_58 = (uv_pipe_t *)0x1aa841;
    ipc_helper_tcp_connection_cold_15();
  }
  iVar1 = (int)auStack_50 + 8;
  puStack_58 = (uv_pipe_t *)ipc_on_connection_tcp_conn;
  ipc_helper_tcp_connection_cold_16();
  plVar7 = alStack_78;
  auStack_68._0_8_ = SEXT48(iVar1);
  alStack_78[0] = 0;
  puStack_58 = unaff_RBX;
  if (auStack_68._0_8_ == 0) {
    if (puVar6 != &tcp_server) goto LAB_001aa99c;
    pcStack_80 = (code *)0x1aa88c;
    puVar3 = (uv_pipe_t *)malloc(0xd8);
    if (puVar3 == (uv_pipe_t *)0x0) goto LAB_001aa9a1;
    pcStack_80 = (code *)0x1aa8a7;
    iVar1 = uv_tcp_init(tcp_server.loop,puVar3);
    auStack_68._0_8_ = SEXT48(iVar1);
    alStack_78[0] = 0;
    unaff_RBX = puVar3;
    if (auStack_68._0_8_ != 0) goto LAB_001aa9a6;
    pcStack_80 = (code *)0x1aa8d4;
    iVar1 = uv_accept(&tcp_server,puVar3);
    auStack_68._0_8_ = SEXT48(iVar1);
    alStack_78[0] = 0;
    if (auStack_68._0_8_ != 0) goto LAB_001aa9b3;
    pcStack_80 = (code *)0x1aa903;
    auStack_68 = uv_buf_init("hello\n",6);
    pcStack_80 = (code *)0x1aa930;
    iVar1 = uv_write2(&conn_notify_req,&channel,auStack_68,1,puVar3,0);
    alStack_78[0] = (long)iVar1;
    alStack_78[1] = 0;
    if (alStack_78[0] != 0) goto LAB_001aa9c0;
    pcStack_80 = (code *)0x1aa960;
    iVar1 = uv_read_start(puVar3,on_read_alloc,on_tcp_child_process_read);
    alStack_78[0] = (long)iVar1;
    alStack_78[1] = 0;
    if (alStack_78[0] == 0) {
      pcStack_80 = (code *)0x1aa989;
      uv_close(puVar3,close_and_free_cb);
      return;
    }
  }
  else {
    pcStack_80 = (code *)0x1aa99c;
    ipc_on_connection_tcp_conn_cold_1();
LAB_001aa99c:
    pcStack_80 = (code *)0x1aa9a1;
    ipc_on_connection_tcp_conn_cold_2();
LAB_001aa9a1:
    pcStack_80 = (code *)0x1aa9a6;
    ipc_on_connection_tcp_conn_cold_7();
LAB_001aa9a6:
    pcStack_80 = (code *)0x1aa9b3;
    ipc_on_connection_tcp_conn_cold_3();
LAB_001aa9b3:
    pcStack_80 = (code *)0x1aa9c0;
    ipc_on_connection_tcp_conn_cold_4();
LAB_001aa9c0:
    pcStack_80 = (code *)0x1aa9cd;
    ipc_on_connection_tcp_conn_cold_5();
  }
  iVar1 = (int)alStack_78 + 8;
  pcStack_80 = connect_child_process_cb;
  ipc_on_connection_tcp_conn_cold_6();
  pcStack_80 = (code *)(long)iVar1;
  uStack_88 = 0;
  if (pcStack_80 == (code *)0x0) {
    puStack_98 = (uv_pipe_t *)0x1aaa12;
    iVar1 = uv_read_start(*(undefined8 *)((long)plVar7 + 0x50),on_read_alloc,
                          on_tcp_child_process_read);
    pcStack_80 = (code *)(long)iVar1;
    uStack_88 = 0;
    if (pcStack_80 == (code *)0x0) {
      return;
    }
  }
  else {
    puStack_98 = (uv_pipe_t *)0x1aaa42;
    connect_child_process_cb_cold_1();
  }
  puStack_98 = (uv_pipe_t *)ipc_helper_bind_twice;
  connect_child_process_cb_cold_2();
  puStack_d0 = (uv_pipe_t *)0x1aaa6c;
  puStack_98 = unaff_RBX;
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,auStack_a8);
  auStack_b8._0_8_ = SEXT48(iVar1);
  lStack_c8 = 0;
  if (auStack_b8._0_8_ == 0) {
    puStack_d0 = (uv_pipe_t *)0x1aaa8f;
    uVar2 = uv_default_loop();
    puStack_d0 = (uv_pipe_t *)0x1aaaa3;
    iVar1 = uv_pipe_init(uVar2,&channel,1);
    auStack_b8._0_8_ = SEXT48(iVar1);
    lStack_c8 = 0;
    if (auStack_b8._0_8_ != 0) goto LAB_001aad4c;
    unaff_RBX = &channel;
    puStack_d0 = (uv_pipe_t *)0x1aaad2;
    uv_pipe_open(&channel,0);
    auStack_b8._0_8_ = 1;
    puStack_d0 = (uv_pipe_t *)0x1aaae3;
    iVar1 = uv_is_readable(&channel);
    lStack_c8 = (long)iVar1;
    if (auStack_b8._0_8_ != lStack_c8) goto LAB_001aad59;
    auStack_b8._0_8_ = 1;
    puStack_d0 = (uv_pipe_t *)0x1aab0d;
    iVar1 = uv_is_writable(&channel);
    lStack_c8 = (long)iVar1;
    if (auStack_b8._0_8_ != lStack_c8) goto LAB_001aad66;
    puStack_d0 = (uv_pipe_t *)0x1aab2e;
    iVar1 = uv_is_closing(&channel);
    auStack_b8._0_8_ = SEXT48(iVar1);
    lStack_c8 = 0;
    if (auStack_b8._0_8_ != 0) goto LAB_001aad73;
    puStack_d0 = (uv_pipe_t *)0x1aab5d;
    auStack_b8 = uv_buf_init("hello\n",6);
    puStack_d0 = (uv_pipe_t *)0x1aab6c;
    uVar2 = uv_default_loop();
    puStack_d0 = (uv_pipe_t *)0x1aab7b;
    iVar1 = uv_tcp_init(uVar2,&tcp_server);
    lStack_c8 = (long)iVar1;
    lStack_c0 = 0;
    if (lStack_c8 != 0) goto LAB_001aad80;
    puStack_d0 = (uv_pipe_t *)0x1aab9e;
    uVar2 = uv_default_loop();
    puStack_d0 = (uv_pipe_t *)0x1aabad;
    iVar1 = uv_tcp_init(uVar2,&tcp_server2);
    lStack_c8 = (long)iVar1;
    lStack_c0 = 0;
    if (lStack_c8 != 0) goto LAB_001aad8d;
    puStack_d0 = (uv_pipe_t *)0x1aabde;
    iVar1 = uv_tcp_bind(&tcp_server,auStack_a8,0);
    lStack_c8 = (long)iVar1;
    lStack_c0 = 0;
    if (lStack_c8 != 0) goto LAB_001aad9a;
    puStack_d0 = (uv_pipe_t *)0x1aac0f;
    iVar1 = uv_tcp_bind(&tcp_server2,auStack_a8,0);
    lStack_c8 = (long)iVar1;
    lStack_c0 = 0;
    if (lStack_c8 != 0) goto LAB_001aada7;
    puStack_d0 = (uv_pipe_t *)0x1aac54;
    iVar1 = uv_write2(&write_req,&channel,auStack_b8,1,&tcp_server,0);
    lStack_c8 = (long)iVar1;
    lStack_c0 = 0;
    if (lStack_c8 != 0) goto LAB_001aadb4;
    puStack_d0 = (uv_pipe_t *)0x1aac99;
    iVar1 = uv_write2(&write_req2,&channel,auStack_b8,1,&tcp_server2,0);
    lStack_c8 = (long)iVar1;
    lStack_c0 = 0;
    if (lStack_c8 != 0) goto LAB_001aadc1;
    puStack_d0 = (uv_pipe_t *)0x1aacbc;
    uVar2 = uv_default_loop();
    puStack_d0 = (uv_pipe_t *)0x1aacc6;
    iVar1 = uv_run(uVar2,0);
    lStack_c8 = (long)iVar1;
    lStack_c0 = 0;
    if (lStack_c8 != 0) goto LAB_001aadce;
    puStack_d0 = (uv_pipe_t *)0x1aace9;
    unaff_RBX = (uv_pipe_t *)uv_default_loop();
    puStack_d0 = (uv_pipe_t *)0x1aacfd;
    uv_walk(unaff_RBX,close_walk_cb,0);
    puStack_d0 = (uv_pipe_t *)0x1aad07;
    uv_run(unaff_RBX,0);
    lStack_c8 = 0;
    puStack_d0 = (uv_pipe_t *)0x1aad14;
    uVar2 = uv_default_loop();
    puStack_d0 = (uv_pipe_t *)0x1aad1c;
    iVar1 = uv_loop_close(uVar2);
    lStack_c0 = (long)iVar1;
    if (lStack_c8 == lStack_c0) {
      puStack_d0 = (uv_pipe_t *)0x1aad37;
      uv_library_shutdown();
      return;
    }
  }
  else {
    puStack_d0 = (uv_pipe_t *)0x1aad4c;
    ipc_helper_bind_twice_cold_1();
LAB_001aad4c:
    puStack_d0 = (uv_pipe_t *)0x1aad59;
    ipc_helper_bind_twice_cold_2();
LAB_001aad59:
    puStack_d0 = (uv_pipe_t *)0x1aad66;
    ipc_helper_bind_twice_cold_3();
LAB_001aad66:
    puStack_d0 = (uv_pipe_t *)0x1aad73;
    ipc_helper_bind_twice_cold_4();
LAB_001aad73:
    puStack_d0 = (uv_pipe_t *)0x1aad80;
    ipc_helper_bind_twice_cold_5();
LAB_001aad80:
    puStack_d0 = (uv_pipe_t *)0x1aad8d;
    ipc_helper_bind_twice_cold_6();
LAB_001aad8d:
    puStack_d0 = (uv_pipe_t *)0x1aad9a;
    ipc_helper_bind_twice_cold_7();
LAB_001aad9a:
    puStack_d0 = (uv_pipe_t *)0x1aada7;
    ipc_helper_bind_twice_cold_8();
LAB_001aada7:
    puStack_d0 = (uv_pipe_t *)0x1aadb4;
    ipc_helper_bind_twice_cold_9();
LAB_001aadb4:
    puStack_d0 = (uv_pipe_t *)0x1aadc1;
    ipc_helper_bind_twice_cold_10();
LAB_001aadc1:
    puStack_d0 = (uv_pipe_t *)0x1aadce;
    ipc_helper_bind_twice_cold_11();
LAB_001aadce:
    puStack_d0 = (uv_pipe_t *)0x1aaddb;
    ipc_helper_bind_twice_cold_12();
  }
  puStack_d0 = (uv_pipe_t *)ipc_helper_send_zero;
  ipc_helper_bind_twice_cold_13();
  iVar5 = (int)&lStack_f0;
  pcStack_f8 = (code *)0x1aadf6;
  puStack_d0 = unaff_RBX;
  auStack_e0 = uv_buf_init(0,0);
  pcStack_f8 = (code *)0x1aae05;
  uVar2 = uv_default_loop();
  pcStack_f8 = (code *)0x1aae16;
  iVar1 = uv_pipe_init(uVar2,&channel,0);
  lStack_e8 = (long)iVar1;
  lStack_f0 = 0;
  if (lStack_e8 == 0) {
    pcStack_f8 = (code *)0x1aae45;
    uv_pipe_open(&channel,0);
    lStack_e8 = 1;
    pcStack_f8 = (code *)0x1aae56;
    iVar1 = uv_is_readable(&channel);
    lStack_f0 = (long)iVar1;
    if (lStack_e8 != lStack_f0) goto LAB_001aafb5;
    lStack_e8 = 1;
    pcStack_f8 = (code *)0x1aae80;
    iVar1 = uv_is_writable(&channel);
    lStack_f0 = (long)iVar1;
    if (lStack_e8 != lStack_f0) goto LAB_001aafc2;
    pcStack_f8 = (code *)0x1aaea1;
    iVar1 = uv_is_closing(&channel);
    lStack_e8 = (long)iVar1;
    lStack_f0 = 0;
    if (lStack_e8 != 0) goto LAB_001aafcf;
    pcStack_f8 = (code *)0x1aaee3;
    iVar1 = uv_write(&write_req,&channel,auStack_e0,1,send_zero_write_cb);
    lStack_e8 = (long)iVar1;
    lStack_f0 = 0;
    if (lStack_e8 != 0) goto LAB_001aafdc;
    pcStack_f8 = (code *)0x1aaf06;
    uVar2 = uv_default_loop();
    pcStack_f8 = (code *)0x1aaf10;
    iVar1 = uv_run(uVar2,0);
    lStack_e8 = (long)iVar1;
    lStack_f0 = 0;
    if (lStack_e8 != 0) goto LAB_001aafe9;
    lStack_e8 = 1;
    lStack_f0 = (long)send_zero_write;
    if (lStack_f0 == 1) {
      pcStack_f8 = (code *)0x1aaf56;
      uVar2 = uv_default_loop();
      pcStack_f8 = (code *)0x1aaf6a;
      uv_walk(uVar2,close_walk_cb,0);
      pcStack_f8 = (code *)0x1aaf74;
      uv_run(uVar2,0);
      lStack_e8 = 0;
      pcStack_f8 = (code *)0x1aaf82;
      uVar2 = uv_default_loop();
      pcStack_f8 = (code *)0x1aaf8a;
      iVar1 = uv_loop_close(uVar2);
      lStack_f0 = (long)iVar1;
      if (lStack_e8 == lStack_f0) {
        pcStack_f8 = (code *)0x1aafa0;
        uv_library_shutdown();
        return;
      }
      goto LAB_001ab003;
    }
  }
  else {
    pcStack_f8 = (code *)0x1aafb5;
    ipc_helper_send_zero_cold_1();
LAB_001aafb5:
    pcStack_f8 = (code *)0x1aafc2;
    ipc_helper_send_zero_cold_2();
LAB_001aafc2:
    pcStack_f8 = (code *)0x1aafcf;
    ipc_helper_send_zero_cold_3();
LAB_001aafcf:
    pcStack_f8 = (code *)0x1aafdc;
    ipc_helper_send_zero_cold_4();
LAB_001aafdc:
    pcStack_f8 = (code *)0x1aafe9;
    ipc_helper_send_zero_cold_5();
LAB_001aafe9:
    pcStack_f8 = (code *)0x1aaff6;
    ipc_helper_send_zero_cold_6();
  }
  pcStack_f8 = (code *)0x1ab003;
  ipc_helper_send_zero_cold_7();
LAB_001ab003:
  pcStack_f8 = send_zero_write_cb;
  ipc_helper_send_zero_cold_8();
  pcStack_f8 = (code *)(long)iVar5;
  uStack_100 = 0;
  if (pcStack_f8 != (code *)0x0) {
    __size = &uStack_100;
    send_zero_write_cb_cold_1();
    pvVar4 = malloc((size_t)__size);
    *extraout_RDX = pvVar4;
    extraout_RDX[1] = __size;
    return;
  }
  send_zero_write = send_zero_write + 1;
  return;
}

Assistant:

static void ipc_on_connection(uv_stream_t* server, int status) {
  int r;
  uv_buf_t buf;

  if (!connection_accepted) {
    /*
     * Accept the connection and close it.  Also let the other
     * side know.
     */
    ASSERT_OK(status);
    ASSERT_PTR_EQ(&tcp_server, server);

    r = uv_tcp_init(server->loop, &conn.conn);
    ASSERT_OK(r);

    r = uv_accept(server, (uv_stream_t*)&conn.conn);
    ASSERT_OK(r);

    uv_close((uv_handle_t*)&conn.conn, close_cb);

    buf = uv_buf_init("accepted_connection\n", 20);
    r = uv_write2(&conn_notify_req, (uv_stream_t*)&channel, &buf, 1,
      NULL, conn_notify_write_cb);
    ASSERT_OK(r);

    connection_accepted = 1;
  }
}